

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O3

void printSolutions(vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  int iVar1;
  pointer ppsVar2;
  pointer pvVar3;
  int iVar4;
  pointer ppsVar5;
  int iVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nPrinting Solution: \n",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  ppsVar5 = (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppsVar2 = (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar5 != ppsVar2) {
    pvVar3 = (grid->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = (*ppsVar5)->row + -1;
      iVar4 = iVar1 / 9;
      iVar6 = (*ppsVar5)->row + iVar4 * -9;
      if (iVar6 == 0) {
        iVar6 = 9;
      }
      *(int *)(*(long *)&pvVar3[iVar1 / 0x51].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + (long)(iVar4 % 9) * 4) = iVar6;
      ppsVar5 = ppsVar5 + 1;
    } while (ppsVar5 != ppsVar2);
  }
  return;
}

Assistant:

void printSolutions(vector<DancingNode*> &solutions, vector<vector<int>> &grid) 
{ 
    
    cout<<"\nPrinting Solution: \n"<< endl;
    vector<DancingNode*>::iterator i; 
  
    for(i = solutions.begin(); i!=solutions.end(); i++){
        //cout<<(*i)->row<<endl;
        int coverRow = (*i)->row - 1;
        int r = coverRow / 81 ;
        int c = (coverRow / 9 ) % 9;
        int answer = (coverRow % 9) + 1;
        if(answer == 0){
            answer = 9;
        }
        
        grid[r][c] = answer;
    }
}